

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_db_class.cpp
# Opt level: O3

void test_cpp_db::test_conversions_floating_point_invoker(void)

{
  char *pcVar1;
  size_type sVar2;
  ios_base *this;
  char local_1e0 [32];
  undefined1 local_1c0 [376];
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_conversions_floating_point",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  test_conversions_floating_point_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x130;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_conversions_floating_point",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  test_conversions_floating_point_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x130;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_conversions_floating_point",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  test_conversions_floating_point_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x130;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  this = (ios_base *)(local_1c0 + 0x70);
  std::ios_base::~ios_base(this);
  test_conversions_floating_point::test_method((test_conversions_floating_point *)this);
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_conversions_floating_point",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  test_conversions_floating_point_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x130;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_conversions_floating_point",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  test_conversions_floating_point_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x130;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_conversions_floating_point)
{
    cpp_db::value val_f{133.97f}, val_d{4711.0815}, val_ld{15.323l};

    float vf{133.97f};
    double vd{133.97};
    long double vld{133.97l};
    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val_f), int8_t{-123});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val_f), uint8_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val_f), int16_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val_f), uint16_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val_f), int32_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val_f), uint32_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val_f), int64_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val_f), uint64_t{133});
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val_f) - vf) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val_f) - vd) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val_f) - vld) < 1e-5);

    vf = 4711.0815f;
    vd = 4711.0815;
    vld = 4711.0815l;
    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val_d), int8_t{103});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val_d), uint8_t{103});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val_d), int16_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val_d), uint16_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val_d), int32_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val_d), uint32_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val_d), int64_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val_d), uint64_t{4711});
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val_d) - vf) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val_d) - vd) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val_d) - vld) < 1e-5);

    vf = 15.323f;
    vd = 15.323;
    vld = 15.323l;
    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val_ld), int8_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val_ld), uint8_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val_ld), int16_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val_ld), uint16_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val_ld), int32_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val_ld), uint32_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val_ld), int64_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val_ld), uint64_t{15});
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val_ld) - vf) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val_ld) - vd) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val_ld) - vld) < 1e-5);
}